

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicBuiltinVariables::RunIteration
          (BasicBuiltinVariables *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int i;
  GLuint GVar9;
  uint uVar10;
  long lVar11;
  ostream *poVar12;
  uint *puVar13;
  uint uVar14;
  bool *compile_error;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  uvec3 global_size;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  int local_208 [4];
  uint local_1f8 [4];
  ulong local_1e8;
  long local_1e0;
  string local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_208[2] = 0;
  local_208[0] = 0;
  local_208[1] = 0;
  lVar11 = 0;
  do {
    local_208[lVar11] = num_groups->m_data[lVar11] * param_1->m_data[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", local_size_y = ",0x11);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", local_size_z = ",0x11);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,");\nlayout(std430) buffer OutputBuffer {\n  uvec4 num_work_groups[",0x40);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"];\n  uvec4 work_group_size[",0x1b);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"];\n  uvec4 work_group_id[",0x19);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"];\n  uvec4 local_invocation_id[",0x1f);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"];\n  uvec4 global_invocation_id[",0x20);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"];\n  uvec4 local_invocation_index[",0x22);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "];\n} g_out_buffer;\nvoid main() {\n  if ((gl_WorkGroupSize * gl_WorkGroupID + gl_LocalInvocationID) != gl_GlobalInvocationID) return;\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.num_work_groups[global_index] = uvec4(gl_NumWorkGroups, 0);\n  g_out_buffer.work_group_size[global_index] = uvec4(gl_WorkGroupSize, 0);\n  g_out_buffer.work_group_id[global_index] = uvec4(gl_WorkGroupID, 0);\n  g_out_buffer.local_invocation_id[global_index] = uvec4(gl_LocalInvocationID, 0);\n  g_out_buffer.global_invocation_id[global_index] = uvec4(gl_GlobalInvocationID, 0);\n  g_out_buffer.local_invocation_index[global_index] = uvec4(gl_LocalInvocationIndex);\n}"
             ,0x331);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar9 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar8 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar8) {
    uVar10 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
             * param_1->m_data[2] * num_groups->m_data[2];
    uVar18 = (ulong)uVar10;
    uVar14 = uVar10 * 2;
    local_1e8 = (ulong)(uVar10 * 6);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
           local_1b8,local_1e8,(allocator_type *)&local_1d8);
    buffers = &this->m_storage_buffer;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers);
    local_1e0 = uVar18 * 0x60;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,local_1e0,(void *)local_1b8._0_8_,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,local_1e0,(void *)local_1b8._0_8_);
    if (uVar10 != 0) {
      puVar13 = (uint *)local_1b8._0_8_ + 3;
      uVar16 = 0;
      do {
        if ((((((Vector<unsigned_int,_4> *)(puVar13 + -3))->m_data[0] != num_groups->m_data[0]) ||
             (puVar13[-2] != num_groups->m_data[1])) || (puVar13[-1] != num_groups->m_data[2])) ||
           (*puVar13 != 0)) {
          bVar8 = false;
          anon_unknown_0::Output("gl_NumWorkGroups: Invalid data at index %d.\n");
          goto LAB_0091adef;
        }
        uVar16 = uVar16 + 1;
        puVar13 = puVar13 + 4;
      } while (uVar18 != uVar16);
    }
    if (0 < (int)uVar10) {
      puVar13 = ((pointer)(local_1b8._0_8_ + uVar18 * 0x10))->m_data + 3;
      do {
        if (((((Vector<unsigned_int,_4> *)(puVar13 + -3))->m_data[0] != param_1->m_data[0]) ||
            (puVar13[-2] != param_1->m_data[1])) ||
           ((puVar13[-1] != param_1->m_data[2] || (*puVar13 != 0)))) {
          bVar8 = false;
          anon_unknown_0::Output("gl_WorkGroupSize: Invalid data at index %d.\n");
          goto LAB_0091adef;
        }
        uVar15 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar15;
        puVar13 = puVar13 + 4;
      } while (uVar15 < uVar14);
    }
    uVar15 = uVar10 * 3;
    if (uVar14 < uVar15) {
      uVar16 = (ulong)uVar14 << 4 | 0xc;
      uVar18 = 0;
      do {
        uVar6 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar17 = (uVar18 & 0xffffffff) / uVar6;
        uVar7 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        bVar8 = false;
        if (((*(int *)((long)(uint *)local_1b8._0_8_ + (uVar16 - 0xc)) ==
              (int)(((uVar18 & 0xffffffff) % uVar6) / (ulong)param_1->m_data[0])) &&
            (*(int *)((long)(uint *)local_1b8._0_8_ + (uVar16 - 8)) ==
             (int)((uVar17 % uVar7) / (ulong)param_1->m_data[1]))) &&
           (bVar8 = false,
           *(int *)((long)(uint *)local_1b8._0_8_ + (uVar16 - 4)) ==
           (int)((uVar17 / uVar7) / (ulong)param_1->m_data[2]))) {
          bVar8 = *(int *)((long)(uint *)local_1b8._0_8_ + uVar16) == 0;
        }
        if (!bVar8) {
          anon_unknown_0::Output
                    ("gl_WorkGroupID: Invalid data at index %d.\n",(ulong)(uVar14 + (int)uVar18));
          goto LAB_0091aded;
        }
        uVar18 = uVar18 + 1;
        uVar16 = uVar16 + 0x10;
      } while (((ulong)uVar14 - (ulong)uVar15) + uVar18 != 0);
    }
    uVar14 = uVar10 * 4;
    if (uVar15 < uVar14) {
      uVar18 = (ulong)uVar15 << 4 | 0xc;
      uVar16 = 0;
      do {
        uVar6 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar17 = (uVar16 & 0xffffffff) / uVar6;
        uVar7 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        bVar8 = false;
        if (((*(int *)((long)(uint *)local_1b8._0_8_ + (uVar18 - 0xc)) ==
              (int)(((uVar16 & 0xffffffff) % uVar6) % (ulong)param_1->m_data[0])) &&
            (*(int *)((long)(uint *)local_1b8._0_8_ + (uVar18 - 8)) ==
             (int)((uVar17 % uVar7) % (ulong)param_1->m_data[1]))) &&
           (bVar8 = false,
           *(int *)((long)(uint *)local_1b8._0_8_ + (uVar18 - 4)) ==
           (int)((uVar17 / uVar7) % (ulong)param_1->m_data[2]))) {
          bVar8 = *(int *)((long)(uint *)local_1b8._0_8_ + uVar18) == 0;
        }
        if (!bVar8) {
          anon_unknown_0::Output
                    ("gl_LocalInvocationID: Invalid data at index %d.\n",
                     (ulong)(uVar15 + (int)uVar16));
          goto LAB_0091aded;
        }
        uVar16 = uVar16 + 1;
        uVar18 = uVar18 + 0x10;
      } while (((ulong)uVar15 - (ulong)uVar14) + uVar16 != 0);
    }
    uVar15 = uVar10 * 5;
    if (uVar14 < uVar15) {
      uVar18 = (ulong)uVar14 << 4 | 0xc;
      uVar16 = 0;
LAB_0091ac6a:
      uVar17 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
      uVar6 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
      uVar7 = (uVar16 & 0xffffffff) / uVar6;
      bVar8 = false;
      if (((*(int *)((long)(uint *)local_1b8._0_8_ + (uVar18 - 0xc)) ==
            (int)((uVar16 & 0xffffffff) % uVar6)) &&
          (*(int *)((long)(uint *)local_1b8._0_8_ + (uVar18 - 8)) == (int)(uVar7 % uVar17))) &&
         (bVar8 = false,
         *(int *)((long)(uint *)local_1b8._0_8_ + (uVar18 - 4)) == (int)(uVar7 / uVar17))) {
        bVar8 = *(int *)((long)(uint *)local_1b8._0_8_ + uVar18) == 0;
      }
      if (bVar8) goto LAB_0091accf;
      anon_unknown_0::Output
                ("gl_GlobalInvocationID: Invalid data at index %d.\n",(ulong)(uVar14 + (int)uVar16))
      ;
LAB_0091aded:
      bVar8 = false;
      goto LAB_0091adef;
    }
LAB_0091acde:
    bVar8 = (uint)local_1e8 <= uVar15;
    if (!bVar8) {
      uVar18 = (ulong)uVar15;
      do {
        uVar14 = ((pointer)(local_1b8._0_8_ + uVar18 * 0x10))->m_data[0];
        uVar15 = ((pointer)(local_1b8._0_8_ + uVar18 * 0x10))->m_data[1];
        uVar1 = ((pointer)(local_1b8._0_8_ + uVar18 * 0x10))->m_data[2];
        uVar2 = ((pointer)(local_1b8._0_8_ + uVar18 * 0x10))->m_data[3];
        uVar3 = param_1->m_data[0];
        uVar4 = param_1->m_data[1];
        uVar16 = (ulong)(num_groups->m_data[0] * uVar3);
        uVar7 = (ulong)((int)uVar18 + uVar10 * -5);
        uVar17 = uVar7 / uVar16;
        uVar6 = (ulong)(num_groups->m_data[1] * uVar4);
        uVar5 = param_1->m_data[2];
        lVar11 = 0;
        do {
          local_1f8[lVar11] =
               (int)((uVar7 % uVar16) % (ulong)uVar3) +
               ((int)((uVar17 % uVar6) % (ulong)uVar4) +
               (int)((uVar17 / uVar6) % (ulong)uVar5) * uVar4) * uVar3;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        bVar19 = false;
        if (((uVar14 == local_1f8[0]) && (uVar15 == local_1f8[1])) && (uVar1 == local_1f8[2])) {
          bVar19 = uVar2 == local_1f8[3];
        }
        if (!bVar19) {
          anon_unknown_0::Output
                    ("gl_LocalInvocationIndex: Invalid data at index %d.\n",uVar18 & 0xffffffff);
          break;
        }
        uVar18 = uVar18 + 1;
        bVar8 = (local_1e8 & 0xffffffff) <= uVar18;
      } while (uVar18 != (local_1e8 & 0xffffffff));
    }
LAB_0091adef:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
LAB_0091accf:
  uVar16 = uVar16 + 1;
  uVar18 = uVar18 + 0x10;
  if (((ulong)uVar14 - (ulong)uVar15) + uVar16 == 0) goto LAB_0091acde;
  goto LAB_0091ac6a;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		std::vector<uvec4> data(kBufferSize * 6);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kBufferSize * 6, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(uvec4) * kBufferSize * 6, &data[0]);

		// gl_NumWorkGroups
		for (GLuint index = 0; index < kBufferSize; ++index)
		{
			if (!IsEqual(data[index], uvec4(num_groups.x(), num_groups.y(), num_groups.z(), 0)))
			{
				Output("gl_NumWorkGroups: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupSize
		for (GLuint index = kBufferSize; index < 2 * kBufferSize; ++index)
		{
			if (!IsEqual(data[index], uvec4(local_size.x(), local_size.y(), local_size.z(), 0)))
			{
				Output("gl_WorkGroupSize: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupID
		for (GLuint index = 2 * kBufferSize; index < 3 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 2 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() /= local_size.x();
			expected.y() /= local_size.y();
			expected.z() /= local_size.z();
			if (!IsEqual(data[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_WorkGroupID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationID
		for (GLuint index = 3 * kBufferSize; index < 4 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 3 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() %= local_size.x();
			expected.y() %= local_size.y();
			expected.z() %= local_size.z();
			if (!IsEqual(data[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_LocalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_GlobalInvocationID
		for (GLuint index = 4 * kBufferSize; index < 5 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 4 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			if (!IsEqual(data[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_GlobalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationIndex
		for (GLuint index = 5 * kBufferSize; index < 6 * kBufferSize; ++index)
		{
			uvec3 coord = IndexTo3DCoord(index - 5 * kBufferSize, local_size.x() * num_groups.x(),
										 local_size.y() * num_groups.y());
			const GLuint expected = (coord.x() % local_size.x()) + (coord.y() % local_size.y()) * local_size.x() +
									(coord.z() % local_size.z()) * local_size.x() * local_size.y();
			if (!IsEqual(data[index], uvec4(expected)))
			{
				Output("gl_LocalInvocationIndex: Invalid data at index %d.\n", index);
				return false;
			}
		}
		return true;
	}